

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GenImageGradientV(Image *__return_storage_ptr__,int width,int height,Color top,Color bottom)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  pvVar1 = malloc((long)(height * width) << 2);
  if (0 < height) {
    lVar2 = (long)pvVar1 + 3;
    uVar3 = 0;
    do {
      if (0 < width) {
        fVar5 = (float)(int)uVar3 / (float)height;
        fVar6 = 1.0 - fVar5;
        uVar4 = 0;
        do {
          *(char *)(lVar2 + -3 + uVar4 * 4) =
               (char)(int)((float)((uint)bottom & 0xff) * fVar5 + fVar6 * (float)((uint)top & 0xff))
          ;
          *(char *)(lVar2 + -2 + uVar4 * 4) =
               (char)(int)((float)((uint)bottom >> 8 & 0xff) * fVar5 +
                          fVar6 * (float)((uint)top >> 8 & 0xff));
          *(char *)(lVar2 + -1 + uVar4 * 4) =
               (char)(int)((float)((uint)bottom >> 0x10 & 0xff) * fVar5 +
                          fVar6 * (float)((uint)top >> 0x10 & 0xff));
          *(char *)(lVar2 + uVar4 * 4) =
               (char)(int)(fVar5 * (float)((uint)bottom >> 0x18) +
                          fVar6 * (float)((uint)top >> 0x18));
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + (ulong)(uint)width * 4;
    } while (uVar3 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientV(int width, int height, Color top, Color bottom)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int j = 0; j < height; j++)
    {
        float factor = (float)j/(float)height;
        for (int i = 0; i < width; i++)
        {
            pixels[j*width + i].r = (int)((float)bottom.r*factor + (float)top.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)bottom.g*factor + (float)top.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)bottom.b*factor + (float)top.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)bottom.a*factor + (float)top.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}